

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O0

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::UpdatePointToAttributeIndexMapping
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this,PointAttribute *attribute)

{
  bool bVar1;
  bool bVar2;
  ValueType VVar3;
  uint uVar4;
  const_reference pvVar5;
  uint *puVar6;
  long in_RDI;
  AttributeValueIndex att_entry_id;
  VertexIndex vert_id;
  PointIndex point_id;
  int p;
  Face *face;
  FaceIndex f;
  size_t num_points;
  size_t num_faces;
  CornerTable *corner_table;
  MeshAttributeCornerTable *in_stack_ffffffffffffff68;
  CornerIndex corner;
  PointAttribute *in_stack_ffffffffffffff70;
  uint local_5c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_58;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_54;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_50;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_4c;
  int local_48;
  uint local_44;
  Face *local_40;
  uint local_38;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_34;
  ulong local_30;
  ulong local_28;
  CornerTable *local_20;
  
  local_20 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ::corner_table((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             *)(in_RDI + 0x10));
  PointCloud::num_points(*(PointCloud **)(in_RDI + 0xa8));
  PointAttribute::SetExplicitMapping(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  VVar3 = Mesh::num_faces((Mesh *)0x186a32);
  local_28 = (ulong)VVar3;
  VVar3 = PointCloud::num_points(*(PointCloud **)(in_RDI + 0xa8));
  local_30 = (ulong)VVar3;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_34,0);
  do {
    local_38 = (uint)local_28;
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(&local_34,&local_38);
    if (!bVar1) {
      return true;
    }
    local_44 = local_34.value_;
    local_40 = Mesh::face((Mesh *)in_stack_ffffffffffffff68,
                          (FaceIndex)(uint)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      pvVar5 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
               operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *
                          )in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      corner.value_ = (uint)in_stack_ffffffffffffff70;
      local_4c.value_ = pvVar5->value_;
      uVar4 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_34);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType
                (&local_54,uVar4 * 3 + local_48);
      local_50.value_ = (uint)MeshAttributeCornerTable::Vertex(in_stack_ffffffffffffff68,corner);
      bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                        (&local_50,
                         (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                         &kInvalidVertexIndex);
      if (bVar1) {
        return false;
      }
      in_stack_ffffffffffffff70 = (PointAttribute *)(*(long *)(in_RDI + 0xb0) + 0x18);
      uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_50);
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                                  (ulong)uVar4);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_58,*puVar6);
      local_5c = (uint)local_30;
      bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator>=(&local_4c,&local_5c);
      bVar1 = true;
      if (!bVar2) {
        uVar4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_58);
        bVar1 = local_30 <= uVar4;
      }
      if (bVar1) {
        return false;
      }
      PointAttribute::SetPointMapEntry
                ((PointAttribute *)in_stack_ffffffffffffff68,
                 (PointIndex)(uint)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (AttributeValueIndex)(uint)in_stack_ffffffffffffff70);
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_34);
  } while( true );
}

Assistant:

bool UpdatePointToAttributeIndexMapping(PointAttribute *attribute) override {
    const auto *corner_table = traverser_.corner_table();
    attribute->SetExplicitMapping(mesh_->num_points());
    const size_t num_faces = mesh_->num_faces();
    const size_t num_points = mesh_->num_points();
    for (FaceIndex f(0); f < static_cast<uint32_t>(num_faces); ++f) {
      const auto &face = mesh_->face(f);
      for (int p = 0; p < 3; ++p) {
        const PointIndex point_id = face[p];
        const VertexIndex vert_id =
            corner_table->Vertex(CornerIndex(3 * f.value() + p));
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        const AttributeValueIndex att_entry_id(
            encoding_data_
                ->vertex_to_encoded_attribute_value_index_map[vert_id.value()]);
        if (point_id >= num_points || att_entry_id.value() >= num_points) {
          // There cannot be more attribute values than the number of points.
          return false;
        }
        attribute->SetPointMapEntry(point_id, att_entry_id);
      }
    }
    return true;
  }